

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O0

void __thiscall setup::run_entry::load(run_entry *this,istream *is,info *i)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  enum_type eVar4;
  flag_type fVar5;
  int_adapter<unsigned_int> *in_RDX;
  istream *in_RSI;
  long in_RDI;
  stored_flag_reader<flags<setup::run_entry::flags_Enum_,_12UL>_> flagreader;
  istream *in_stack_fffffffffffffeb8;
  istream *this_00;
  istream *in_stack_fffffffffffffec0;
  encoded_string local_c0;
  encoded_string local_a8;
  info *in_stack_ffffffffffffff80;
  istream *in_stack_ffffffffffffff88;
  item *in_stack_ffffffffffffff90;
  encoded_string local_60;
  encoded_string local_48;
  encoded_string local_30;
  int_adapter<unsigned_int> *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar2 < 0x1030000) {
    util::load<unsigned_int>((istream *)0x18957d);
  }
  util::encoded_string::encoded_string
            (&local_30,(string *)(in_RDI + 0x100),local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(in_stack_fffffffffffffec0,(encoded_string *)in_stack_fffffffffffffeb8);
  util::encoded_string::encoded_string
            (&local_48,(string *)(in_RDI + 0x120),local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(in_stack_fffffffffffffec0,(encoded_string *)in_stack_fffffffffffffeb8);
  util::encoded_string::encoded_string
            (&local_60,(string *)(in_RDI + 0x140),local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(in_stack_fffffffffffffec0,(encoded_string *)in_stack_fffffffffffffeb8);
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar2 < 0x1030900) {
    std::__cxx11::string::clear();
  }
  else {
    util::encoded_string::encoded_string
              ((encoded_string *)&stack0xffffffffffffff88,(string *)(in_RDI + 0x160),
               local_18[6].value_);
    util::operator>>(in_stack_fffffffffffffec0,(encoded_string *)in_stack_fffffffffffffeb8);
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar2 < 0x2000200) {
    std::__cxx11::string::clear();
  }
  else {
    util::encoded_string::encoded_string
              ((encoded_string *)&stack0xffffffffffffff70,(string *)(in_RDI + 0x180),
               local_18[6].value_);
    util::operator>>(in_stack_fffffffffffffec0,(encoded_string *)in_stack_fffffffffffffeb8);
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar2 < 0x5010d00) {
    std::__cxx11::string::clear();
  }
  else {
    util::encoded_string::encoded_string(&local_a8,(string *)(in_RDI + 0x1a0),local_18[6].value_);
    util::operator>>(in_stack_fffffffffffffec0,(encoded_string *)in_stack_fffffffffffffeb8);
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if ((0x1ffffff < uVar2) ||
     (bVar1 = setup::version::is_isx((version *)in_stack_fffffffffffffec0), bVar1)) {
    in_stack_fffffffffffffec0 = local_10;
    util::encoded_string::encoded_string(&local_c0,(string *)(in_RDI + 0x1c0),local_18[6].value_);
    util::operator>>(in_stack_fffffffffffffec0,(encoded_string *)in_stack_fffffffffffffeb8);
  }
  item::load_condition_data
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  item::load_version_data
            ((item *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(version *)0x18985b);
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar2 < 0x1031800) {
    *(undefined4 *)(in_RDI + 0x1e0) = 0;
  }
  else {
    iVar3 = util::load<int>((istream *)0x18987c);
    *(int *)(in_RDI + 0x1e0) = iVar3;
  }
  stored_enum<setup::(anonymous_namespace)::stored_run_wait_condition>::stored_enum
            ((stored_enum<setup::(anonymous_namespace)::stored_run_wait_condition> *)
             in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  eVar4 = stored_enum<setup::(anonymous_namespace)::stored_run_wait_condition>::get
                    ((stored_enum<setup::(anonymous_namespace)::stored_run_wait_condition> *)
                     flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>._24_8_);
  *(enum_type *)(in_RDI + 0x1e4) = eVar4;
  setup::version::bits((version *)in_stack_fffffffffffffec0);
  stored_flag_reader<flags<setup::data_entry::flags_Enum_,_12UL>_>::stored_flag_reader
            ((stored_flag_reader<flags<setup::data_entry::flags_Enum_,_12UL>_> *)
             in_stack_fffffffffffffec0,local_10,0x1898f5);
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  this_00 = local_10;
  if (0x10202ff < uVar2) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_stack_fffffffffffffec0,
               (enum_type)((ulong)local_10 >> 0x20));
    this_00 = local_10;
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if ((0x10308ff < uVar2) ||
     ((bVar1 = setup::version::is_isx((version *)in_stack_fffffffffffffec0), bVar1 &&
      (uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18), 0x10307ff < uVar2))
     )) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_stack_fffffffffffffec0,
               (enum_type)((ulong)this_00 >> 0x20));
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x1ffffff < uVar2) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_stack_fffffffffffffec0,
               (enum_type)((ulong)this_00 >> 0x20));
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_stack_fffffffffffffec0,
               (enum_type)((ulong)this_00 >> 0x20));
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_stack_fffffffffffffec0,
               (enum_type)((ulong)this_00 >> 0x20));
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_stack_fffffffffffffec0,
               (enum_type)((ulong)this_00 >> 0x20));
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x20007ff < uVar2) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_stack_fffffffffffffec0,
               (enum_type)((ulong)this_00 >> 0x20));
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x50109ff < uVar2) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_stack_fffffffffffffec0,
               (enum_type)((ulong)this_00 >> 0x20));
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_stack_fffffffffffffec0,
               (enum_type)((ulong)this_00 >> 0x20));
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x501ffff < uVar2) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_stack_fffffffffffffec0,
               (enum_type)((ulong)this_00 >> 0x20));
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x600ffff < uVar2) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_stack_fffffffffffffec0,
               (enum_type)((ulong)this_00 >> 0x20));
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x602ffff < uVar2) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_stack_fffffffffffffec0,
               (enum_type)((ulong)this_00 >> 0x20));
  }
  fVar5 = stored_flag_reader<setup::data_entry::flags_Enum_>::finalize
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)this_00);
  ((Type *)(in_RDI + 0x1e8))->super__Base_bitset<1UL> =
       (_Base_bitset<1UL>)fVar5._flags.super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

void run_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(name, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(parameters, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(working_dir, i.codepage, i.header.lead_bytes);
	if(i.version >= INNO_VERSION(1, 3, 9)) {
		is >> util::encoded_string(run_once_id, i.codepage);
	} else {
		run_once_id.clear();
	}
	if(i.version >= INNO_VERSION(2, 0, 2)) {
		is >> util::encoded_string(status_message, i.codepage);
	} else {
		status_message.clear();
	}
	if(i.version >= INNO_VERSION(5, 1, 13)) {
		is >> util::encoded_string(verb, i.codepage);
	} else {
		verb.clear();
	}
	if(i.version >= INNO_VERSION(2, 0, 0) || i.version.is_isx()) {
		is >> util::encoded_string(description, i.codepage);
	}
	
	load_condition_data(is, i);
	
	load_version_data(is, i.version);
	
	if(i.version >= INNO_VERSION(1, 3, 24)) {
		show_command = util::load<boost::int32_t>(is);
	} else {
		show_command = 0;
	}
	
	wait = stored_enum<stored_run_wait_condition>(is).get();
	
	stored_flag_reader<flags> flagreader(is, i.version.bits());
	
	if(i.version >= INNO_VERSION(1, 2, 3)) {
		flagreader.add(ShellExec);
	}
	if(i.version >= INNO_VERSION(1, 3, 9) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 8))) {
		flagreader.add(SkipIfDoesntExist);
	}
	if(i.version >= INNO_VERSION(2, 0, 0)) {
		flagreader.add(PostInstall);
		flagreader.add(Unchecked);
		flagreader.add(SkipIfSilent);
		flagreader.add(SkipIfNotSilent);
	}
	if(i.version >= INNO_VERSION(2, 0, 8)) {
		flagreader.add(HideWizard);
	}
	if(i.version >= INNO_VERSION(5, 1, 10)) {
		flagreader.add(Bits32);
		flagreader.add(Bits64);
	}
	if(i.version >= INNO_VERSION(5, 2, 0)) {
		flagreader.add(RunAsOriginalUser);
	}
	if(i.version >= INNO_VERSION(6, 1, 0)) {
		flagreader.add(DontLogParameters);
	}
	if(i.version >= INNO_VERSION(6, 3, 0)) {
		flagreader.add(LogOutput);
	}
	
	options = flagreader.finalize();
}